

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::format<char,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>
          (fmt *this,BasicFormatter<char> *f,char **format_str,
          basic_string_view<char,_std::char_traits<char>_> *value)

{
  StringRef SVar1;
  StringRef value_00;
  char *pcVar2;
  size_t size;
  uint64_t uVar3;
  basic_string_view<char,_std::char_traits<char>_> __sv;
  anon_union_16_12_986ea841_for_Value_0 local_418;
  size_t local_408;
  Type TStack_400;
  undefined4 uStack_3fc;
  undefined1 auStack_3f8 [8];
  Arg arg;
  BasicStringRef<char> str;
  libcxx_strviewclone local_3b0 [8];
  basic_ostream<char,_std::char_traits<char>_> output;
  undefined1 local_2a0 [8];
  FormatBuf<char> format_buf;
  allocator<char> local_239;
  undefined1 local_238 [8];
  MemoryBuffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_string_view<char,_std::char_traits<char>_> *value_local;
  char **format_str_local;
  BasicFormatter<char> *f_local;
  
  buffer._528_8_ = format_str;
  std::allocator<char>::allocator();
  internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::MemoryBuffer
            ((MemoryBuffer<char,_500UL,_std::allocator<char>_> *)local_238,&local_239);
  std::allocator<char>::~allocator(&local_239);
  internal::FormatBuf<char>::FormatBuf((FormatBuf<char> *)local_2a0,(Buffer<char> *)local_238);
  std::ostream::ostream(local_3b0,(streambuf *)local_2a0);
  __sv.__size = (size_type)value;
  __sv.__data = *(value_type **)(buffer._528_8_ + 8);
  libcxx_strviewclone::operator<<
            (local_3b0,*(basic_ostream<char,_std::char_traits<char>_> **)buffer._528_8_,__sv);
  pcVar2 = Buffer<char>::operator[]((Buffer<char> *)local_238,0);
  size = internal::FormatBuf<char>::size((FormatBuf<char> *)local_2a0);
  BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)&arg.field_0x18,pcVar2,size);
  value_00.size_ = (size_t)str.data_;
  value_00.data_ = (char *)arg._24_8_;
  internal::MakeValue<char>::MakeValue((MakeValue<char> *)&local_418.string,value_00);
  arg.super_Value.field_0.string.size = local_408;
  arg.type = TStack_400;
  arg._20_4_ = uStack_3fc;
  auStack_3f8 = (undefined1  [8])local_418.long_long_value;
  arg.super_Value.field_0.long_long_value = local_418.string.size;
  SVar1.size_ = (size_t)str.data_;
  SVar1.data_ = (char *)arg._24_8_;
  uVar3 = internal::MakeValue<char>::type(SVar1);
  arg.super_Value.field_0.string.size._0_4_ = (int)uVar3;
  pcVar2 = BasicFormatter<char>::format((BasicFormatter<char> *)this,(char **)f,(Arg *)auStack_3f8);
  (f->super_FormatterBase).args_.types_ = (uint64_t)pcVar2;
  std::ostream::~ostream(local_3b0);
  internal::FormatBuf<char>::~FormatBuf((FormatBuf<char> *)local_2a0);
  internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::~MemoryBuffer
            ((MemoryBuffer<char,_500UL,_std::allocator<char>_> *)local_238);
  return;
}

Assistant:

void format(BasicFormatter<Char> &f, const Char *&format_str, const T &value) {
  internal::MemoryBuffer<Char, internal::INLINE_BUFFER_SIZE> buffer;

  internal::FormatBuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output << value;

  BasicStringRef<Char> str(&buffer[0], format_buf.size());
  internal::Arg arg = internal::MakeValue<Char>(str);
  arg.type = static_cast<internal::Arg::Type>(
        internal::MakeValue<Char>::type(str));
  format_str = f.format(format_str, arg);
}